

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * __thiscall
CPP::WriteInitialization::Item::writeSetupUi
          (Item *this,QString *parent,EmptyItemPolicy emptyItemPolicy)

{
  QStringView name;
  QStringView name_00;
  bool bVar1;
  Language LVar2;
  QTextStream *pQVar3;
  QString *pQVar4;
  const_iterator o;
  int in_ECX;
  Item *in_RDX;
  QTextStream *in_RSI;
  Driver *in_RDI;
  long in_FS_OFFSET;
  Item *child;
  add_const_t<QList<CPP::WriteInitialization::Item_*>_> *__range1;
  bool generateMultiDirective;
  QString *uniqueName;
  const_iterator __end1;
  const_iterator __begin1;
  ConstIterator it;
  QStringBuilder<QLatin1String,_QString> *in_stack_fffffffffffffe88;
  QTextStream *in_stack_fffffffffffffe90;
  QLatin1String *in_stack_fffffffffffffe98;
  QStringView *in_stack_fffffffffffffea0;
  storage_type_conflict *psVar5;
  Driver *str;
  undefined2 in_stack_fffffffffffffed8;
  undefined1 uVar6;
  byte bVar7;
  Driver *this_00;
  const_iterator local_e0 [9];
  const_iterator local_98;
  const_iterator local_90;
  QLatin1StringView local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ECX == 0) && (*(int *)(in_RSI + 0x10) == 1)) {
    QString::QString((QString *)0x140692);
    str = in_RDI;
  }
  else {
    bVar7 = 0;
    str = in_RDI;
    pQVar3 = in_RSI;
    this_00 = in_RDI;
    if ((in_ECX == 1) &&
       (bVar1 = QList<CPP::WriteInitialization::Item_*>::isEmpty
                          ((QList<CPP::WriteInitialization::Item_*> *)0x1406b5), bVar1)) {
      if (*(int *)(in_RSI + 0x10) == 1) {
        pQVar3 = (QTextStream *)
                 QTextStream::operator<<
                           (*(QTextStream **)(in_RSI + 0x80),(QString *)(in_RSI + 0x68));
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)language::operatorNew);
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)(in_RSI + 0x50));
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'(');
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)in_RDX);
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,')');
        QTextStream::operator<<(pQVar3,(QString *)language::eol);
        QString::QString((QString *)0x14073e);
        goto LAB_00140c5e;
      }
      if (*(int *)(in_RSI + 0x10) == 2) {
        bVar7 = 1;
      }
    }
    if ((bVar7 & 1) != 0) {
      generateMultiDirectiveBegin(in_RSI,(QSet<QString> *)str);
    }
    uVar6 = 0;
    ((DataPointer *)&in_RDI->_vptr_Driver)->d = (Data *)0xaaaaaaaaaaaaaaaa;
    *(char16_t **)&in_RDI->m_option = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->m_option).inputFile.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    psVar5 = *(storage_type_conflict **)(in_RSI + 0x90);
    local_58 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
    QString::toLower((QString *)in_stack_fffffffffffffe88);
    ::operator+(in_stack_fffffffffffffe98,(QString *)in_stack_fffffffffffffe90);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe88);
    QString::QString((QString *)0x140822);
    Driver::unique(this_00,(QString *)pQVar3,(QString *)in_RDX);
    QString::~QString((QString *)0x14084e);
    QString::~QString((QString *)0x14085b);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x140868);
    QString::~QString((QString *)0x140875);
    QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),(QString *)(in_RSI + 0x68));
    LVar2 = language::language();
    if (LVar2 == Cpp) {
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),(QString *)(in_RSI + 0x50));
      QTextStream::operator<<(pQVar3," *");
    }
    pQVar3 = (QTextStream *)
             QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),(QString *)in_RDI);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," = ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)language::operatorNew);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)(in_RSI + 0x50));
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'(');
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)in_RDX);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,')');
    QTextStream::operator<<(pQVar3,(QString *)language::eol);
    if ((bVar7 & 1) != 0) {
      QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),"#else\n");
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),(QString *)(in_RSI + 0x68));
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)language::operatorNew);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)(in_RSI + 0x50));
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'(');
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)in_RDX);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,')');
      QTextStream::operator<<(pQVar3,(QString *)language::eol);
      generateMultiDirectiveEnd
                (in_stack_fffffffffffffe90,(QSet<QString> *)in_stack_fffffffffffffe88);
    }
    local_90._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_90._M_node =
         (_Base_ptr)
         QMultiMap<QString,_QString>::constBegin
                   ((QMultiMap<QString,_QString> *)in_stack_fffffffffffffe88);
    while( true ) {
      local_98._M_node =
           (_Base_ptr)
           QMultiMap<QString,_QString>::constEnd
                     ((QMultiMap<QString,_QString> *)in_stack_fffffffffffffe88);
      bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffe90,
                           (const_iterator *)in_stack_fffffffffffffe88);
      if (!bVar1) break;
      QMultiMap<QString,_QString>::const_iterator::key((const_iterator *)0x140a34);
      bVar1 = QString::isEmpty((QString *)0x140a3c);
      if (!bVar1) {
        in_stack_fffffffffffffea0 = *(QStringView **)(in_RSI + 0x80);
        QMultiMap<QString,_QString>::const_iterator::key((const_iterator *)0x140a5e);
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffea0,(QString *)in_stack_fffffffffffffe98);
        name.m_data = psVar5;
        name.m_size = (qsizetype)in_stack_fffffffffffffea0;
        language::openQtConfig::openQtConfig((openQtConfig *)in_stack_fffffffffffffe88,name);
        language::operator<<((QTextStream *)str,(openQtConfig *)in_RDI);
      }
      pQVar3 = (QTextStream *)
               QTextStream::operator<<(*(QTextStream **)(in_RSI + 0x80),(QString *)(in_RSI + 0x68));
      in_stack_fffffffffffffe98 = (QLatin1String *)QTextStream::operator<<(pQVar3,(QString *)in_RDI)
      ;
      pQVar4 = QMultiMap<QString,_QString>::const_iterator::value((const_iterator *)0x140ad1);
      QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffe98,pQVar4);
      ::operator<<(in_stack_fffffffffffffe90,(QTextStreamFunction)in_stack_fffffffffffffe88);
      QMultiMap<QString,_QString>::const_iterator::key((const_iterator *)0x140afa);
      bVar1 = QString::isEmpty((QString *)0x140b02);
      if (!bVar1) {
        in_stack_fffffffffffffe90 = *(QTextStream **)(in_RSI + 0x80);
        QMultiMap<QString,_QString>::const_iterator::key((const_iterator *)0x140b24);
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffea0,(QString *)in_stack_fffffffffffffe98);
        name_00.m_data = psVar5;
        name_00.m_size = (qsizetype)in_stack_fffffffffffffea0;
        language::closeQtConfig::closeQtConfig((closeQtConfig *)in_stack_fffffffffffffe88,name_00);
        language::operator<<((QTextStream *)str,(closeQtConfig *)in_RDI);
      }
      QMultiMap<QString,_QString>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffe90);
    }
    pQVar3 = in_RSI + 0x30;
    local_e0[0].i = (Item **)0xaaaaaaaaaaaaaaaa;
    local_e0[0] = QList<CPP::WriteInitialization::Item_*>::begin
                            ((QList<CPP::WriteInitialization::Item_*> *)in_stack_fffffffffffffe90);
    o = QList<CPP::WriteInitialization::Item_*>::end
                  ((QList<CPP::WriteInitialization::Item_*> *)in_stack_fffffffffffffe90);
    while (bVar1 = QList<CPP::WriteInitialization::Item_*>::const_iterator::operator!=(local_e0,o),
          bVar1) {
      QList<CPP::WriteInitialization::Item_*>::const_iterator::operator*(local_e0);
      writeSetupUi(in_RDX,(QString *)
                          CONCAT44(in_ECX,CONCAT13(bVar7,CONCAT12(uVar6,in_stack_fffffffffffffed8)))
                   ,(EmptyItemPolicy)((ulong)pQVar3 >> 0x20));
      QString::~QString((QString *)0x140c37);
      QList<CPP::WriteInitialization::Item_*>::const_iterator::operator++(local_e0);
    }
  }
LAB_00140c5e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)str;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::Item::writeSetupUi(const QString &parent, Item::EmptyItemPolicy emptyItemPolicy)
{
    if (emptyItemPolicy == Item::DontConstruct && m_setupUiData.policy == ItemData::DontGenerate)
        return {};

    bool generateMultiDirective = false;
    if (emptyItemPolicy == Item::ConstructItemOnly && m_children.isEmpty()) {
        if (m_setupUiData.policy == ItemData::DontGenerate) {
            m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
                << '(' << parent << ')' << language::eol;
            return {};
        }
        if (m_setupUiData.policy == ItemData::GenerateWithMultiDirective)
            generateMultiDirective = true;
    }

    if (generateMultiDirective)
        generateMultiDirectiveBegin(m_setupUiStream, m_setupUiData.directives);

    const QString uniqueName = m_driver->unique("__"_L1 + m_itemClassName.toLower());
    m_setupUiStream << m_indent;
    if (language::language() == Language::Cpp)
        m_setupUiStream << m_itemClassName << " *";
    m_setupUiStream << uniqueName
        << " = " << language::operatorNew << m_itemClassName << '(' << parent
        << ')' << language::eol;

    if (generateMultiDirective) {
        m_setupUiStream << "#else\n";
        m_setupUiStream << m_indent << language::operatorNew << m_itemClassName
            << '(' << parent << ')' << language::eol;
        generateMultiDirectiveEnd(m_setupUiStream, m_setupUiData.directives);
    }

    QMultiMap<QString, QString>::ConstIterator it = m_setupUiData.setters.constBegin();
    while (it != m_setupUiData.setters.constEnd()) {
        if (!it.key().isEmpty())
            m_setupUiStream << language::openQtConfig(it.key());
        m_setupUiStream << m_indent << uniqueName << it.value() << Qt::endl;
        if (!it.key().isEmpty())
            m_setupUiStream << language::closeQtConfig(it.key());
        ++it;
    }
    for (Item *child : std::as_const(m_children))
        child->writeSetupUi(uniqueName);
    return uniqueName;
}